

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

SMatrix<double,_3,_3> * gmath::operator*(SMatrix<double,_3,_3> *a,SMatrix<double,_3,_3> *b)

{
  double *pdVar1;
  SMatrix<double,_3,_3> *in_RDX;
  SMatrix<double,_3,_3> *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  double dVar2;
  double dVar3;
  int j;
  int i;
  int k;
  SMatrix<double,_3,_3> *ret;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  SMatrix<double,_3,_3>::SMatrix(in_RDI);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,local_1c,local_20);
      *pdVar1 = 0.0;
      for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
        dVar2 = SMatrix<double,_3,_3>::operator()(in_RSI,local_1c,local_24);
        dVar3 = SMatrix<double,_3,_3>::operator()(in_RDX,local_24,local_20);
        pdVar1 = SMatrix<double,_3,_3>::operator()(in_RDI,local_1c,local_20);
        *pdVar1 = dVar2 * dVar3 + *pdVar1;
      }
    }
  }
  return in_RDI;
}

Assistant:

inline SMatrix<T, n, m> operator*(const SMatrix<T, n, u> &a,
    const SMatrix<T, u, m> &b)
{
  SMatrix<T, n, m> ret;

  for (int k=0; k<n; k++)
  {
    for (int i=0; i<m; i++)
    {
      ret(k, i)=0;

      for (int j=0; j<u; j++)
      {
        ret(k, i)+=a(k, j)*b(j, i);
      }
    }
  }

  return ret;
}